

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QByteArray * __thiscall QMap<int,_QByteArray>::operator[](QMap<int,_QByteArray> *this,int *key)

{
  bool bVar1;
  pointer ppVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QByteArray>_>,_bool> pVar3;
  iterator i;
  QMap<int,_QByteArray> copy;
  map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>
  *in_stack_ffffffffffffff08;
  value_type *in_stack_ffffffffffffff10;
  QByteArray *pQVar4;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                      *)in_stack_ffffffffffffff10);
  if (bVar1) {
    QMap((QMap<int,_QByteArray> *)in_stack_ffffffffffffff10,
         (QMap<int,_QByteArray> *)in_stack_ffffffffffffff08);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<int,_QByteArray> *)0x75966f);
  }
  detach((QMap<int,_QByteArray> *)in_stack_ffffffffffffff10);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                *)0x759697);
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>
       ::find(in_stack_ffffffffffffff08,(key_type *)0x7596b1);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                *)0x7596cf);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>
       ::end(in_stack_ffffffffffffff08);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>_>_>
                  *)0x759714);
    QByteArray::QByteArray((QByteArray *)0x759745);
    std::pair<const_int,_QByteArray>::pair<QByteArray,_true>
              (in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08,(QByteArray *)0x75975c);
    pVar3 = std::
            map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>
            ::insert((map<int,_QByteArray,_std::less<int>,_std::allocator<std::pair<const_int,_QByteArray>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                     in_stack_ffffffffffffff10);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_int,_QByteArray>::~pair((pair<const_int,_QByteArray> *)0x7597ce);
    QByteArray::~QByteArray((QByteArray *)0x7597db);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_QByteArray>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_QByteArray>_> *)0x759843);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<int,_QByteArray> *)0x759859);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }